

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::RandomNormalStaticLayerParams::InternalSwap
          (RandomNormalStaticLayerParams *this,RandomNormalStaticLayerParams *other)

{
  intptr_t iVar1;
  void *pvVar2;
  void *pvVar3;
  int64_t iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar6 = (this->outputshape_).current_size_;
  iVar7 = (this->outputshape_).total_size_;
  pvVar2 = (this->outputshape_).arena_or_elements_;
  iVar5 = (other->outputshape_).total_size_;
  pvVar3 = (other->outputshape_).arena_or_elements_;
  (this->outputshape_).current_size_ = (other->outputshape_).current_size_;
  (this->outputshape_).total_size_ = iVar5;
  (this->outputshape_).arena_or_elements_ = pvVar3;
  (other->outputshape_).current_size_ = iVar6;
  (other->outputshape_).total_size_ = iVar7;
  (other->outputshape_).arena_or_elements_ = pvVar2;
  iVar4 = this->seed_;
  fVar10 = this->mean_;
  fVar11 = this->stddev_;
  fVar8 = other->mean_;
  fVar9 = other->stddev_;
  this->seed_ = other->seed_;
  this->mean_ = fVar8;
  this->stddev_ = fVar9;
  other->seed_ = iVar4;
  other->mean_ = fVar10;
  other->stddev_ = fVar11;
  return;
}

Assistant:

void RandomNormalStaticLayerParams::InternalSwap(RandomNormalStaticLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  outputshape_.InternalSwap(&other->outputshape_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(RandomNormalStaticLayerParams, stddev_)
      + sizeof(RandomNormalStaticLayerParams::stddev_)
      - PROTOBUF_FIELD_OFFSET(RandomNormalStaticLayerParams, seed_)>(
          reinterpret_cast<char*>(&seed_),
          reinterpret_cast<char*>(&other->seed_));
}